

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elf.c
# Opt level: O1

int elf_zlib_inflate_table(uchar *codes,size_t codes_len,uint16_t *zdebug_table,uint16_t *table)

{
  ulong uVar1;
  ushort uVar2;
  ushort uVar3;
  bool bVar4;
  uint uVar5;
  long lVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  uint uVar10;
  ulong uVar11;
  ulong uVar12;
  int iVar13;
  ulong uVar14;
  uint16_t uVar15;
  size_t sVar16;
  uint uVar17;
  uint uVar18;
  ulong uVar19;
  uint uVar20;
  ulong uVar21;
  uint uVar22;
  ulong uVar23;
  ulong uVar24;
  ulong uVar25;
  uint uVar26;
  ushort auStack_e8 [4];
  uint16_t prev [16];
  uint16_t start [16];
  uint16_t firstcode [7];
  uint16_t count [16];
  uint local_34;
  
  firstcode[3] = 0;
  firstcode[4] = 0;
  firstcode[5] = 0;
  firstcode[6] = 0;
  if (codes_len != 0) {
    sVar16 = 0;
    do {
      uVar8 = (ulong)codes[sVar16];
      if (0xf < uVar8) {
        return 0;
      }
      uVar15 = (uint16_t)sVar16;
      if (firstcode[uVar8 + 3] == 0) {
        prev[uVar8 + 0xc] = uVar15;
      }
      else {
        zdebug_table[(ulong)auStack_e8[uVar8] + 0x800] = uVar15;
        uVar8 = (ulong)codes[sVar16];
      }
      auStack_e8[uVar8] = uVar15;
      firstcode[(ulong)codes[sVar16] + 3] = firstcode[(ulong)codes[sVar16] + 3] + 1;
      sVar16 = sVar16 + 1;
    } while (codes_len != sVar16);
  }
  memset(table,0,0x800);
  lVar6 = 1;
  uVar10 = 0;
  do {
    uVar2 = firstcode[lVar6 + 3];
    if (uVar2 == 0) {
      iVar13 = 7;
    }
    else {
      iVar13 = 1;
      uVar20 = 1 << ((byte)lVar6 & 0x1f);
      uVar18 = (uint)uVar2;
      if (uVar18 <= uVar20) {
        uVar17 = (uint)prev[lVar6 + 0xc];
        uVar26 = 1 << ((byte)(lVar6 + -1) & 0x1f);
        uVar8 = 0;
        do {
          if (uVar17 < 0x200) {
            if (uVar10 < 0x100) {
              uVar23 = (ulong)uVar10;
              do {
                if (table[uVar23] != 0) goto LAB_00114c48;
                table[uVar23] = (short)(lVar6 + -1) * 0x200 | (ushort)uVar17;
                uVar23 = uVar23 + uVar20;
              } while (uVar23 < 0x100);
            }
            uVar5 = uVar26;
            if (uVar8 + 1 < (ulong)uVar18) {
              uVar17 = (uint)zdebug_table[(ulong)uVar17 + 0x800];
            }
            do {
              uVar22 = uVar5;
              uVar5 = uVar22 >> 1;
            } while ((uVar22 & uVar10) != 0);
            uVar10 = (uVar22 - 1 & uVar10) + uVar22;
            if (uVar22 == 0) {
              uVar10 = 0;
            }
            bVar4 = true;
          }
          else {
LAB_00114c48:
            bVar4 = false;
          }
          if (!bVar4) goto LAB_00114c57;
          uVar8 = uVar8 + 1;
        } while (uVar8 != uVar18);
        iVar13 = 0;
      }
    }
LAB_00114c57:
    if ((iVar13 != 7) && (iVar13 != 0)) {
      return 0;
    }
    lVar6 = lVar6 + 1;
  } while (lVar6 != 9);
  lVar6 = 9;
  do {
    uVar18 = (uint)firstcode[lVar6 + 3];
    if (firstcode[lVar6 + 3] == 0) {
      iVar13 = 0x12;
    }
    else {
      start[lVar6 + 4] = (uint16_t)uVar10;
      lVar7 = 0;
      do {
        if ((uVar18 >> ((uint)lVar7 & 0x1f) & 1) != 0) {
          uVar20 = 1 << ((char)(lVar6 - lVar7) - 1U & 0x1f);
          uVar8 = 1;
          do {
            if ((uVar20 & uVar10) == 0) {
              uVar10 = uVar10 + uVar20;
              break;
            }
            uVar10 = uVar10 & ~uVar20;
            uVar20 = uVar20 >> 1;
            bVar4 = uVar8 < (ulong)(lVar6 - lVar7);
            uVar8 = (ulong)((int)uVar8 + 1);
          } while (bVar4);
          uVar18 = uVar18 & ~(1 << ((byte)lVar7 & 0x1f));
        }
        lVar7 = lVar7 + 1;
      } while (lVar7 != lVar6);
      iVar13 = 0;
      if (uVar18 != 0) {
        iVar13 = 1;
      }
    }
    if ((iVar13 != 0x12) && (iVar13 != 0)) {
      return 0;
    }
    lVar6 = lVar6 + 1;
  } while (lVar6 != 0x10);
  uVar8 = 0xf;
  uVar23 = 0;
  do {
    uVar21 = (ulong)firstcode[uVar8 + 3];
    iVar13 = 1;
    if (uVar21 == 0) {
      iVar13 = 0x1b;
    }
    else {
      local_34 = (uint)prev[uVar8 + 0xc];
      uVar24 = (ulong)start[uVar8 + 4];
      uVar1 = uVar8 - 8;
      uVar18 = 1 << ((byte)uVar1 & 0x1f);
      uVar2 = (short)uVar1 * 0x200;
      uVar10 = 1 << ((char)uVar8 - 1U & 0x1f);
      uVar12 = 0;
      uVar9 = 0;
      uVar19 = 0;
      uVar14 = 0x100;
      uVar25 = uVar23;
      do {
        uVar11 = uVar24 & 0xff;
        uVar23 = uVar25;
        if (uVar14 == uVar11) {
LAB_00114dfa:
          uVar11 = uVar14;
          uVar14 = uVar24 >> 8;
          uVar20 = 1 << ((byte)uVar9 & 0x1f);
          if ((uint)(uVar24 >> 8) < uVar20) {
            do {
              if (table[uVar19 + uVar14 + 0x100] != 0) {
                bVar4 = false;
                goto LAB_00114e81;
              }
              table[uVar19 + uVar14 + 0x100] = uVar2 | (ushort)local_34;
              uVar14 = uVar14 + uVar18;
            } while (uVar14 < uVar20);
          }
          uVar20 = uVar10;
          if (uVar12 + 1 < uVar21) {
            local_34 = (uint)zdebug_table[(ulong)local_34 + 0x800];
          }
          do {
            uVar17 = uVar20;
            uVar20 = uVar17 >> 1;
          } while ((uVar17 & (uint)uVar24) != 0);
          uVar20 = (uVar17 - 1 & (uint)uVar24) + uVar17;
          if (uVar17 == 0) {
            uVar20 = 0;
          }
          bVar4 = true;
          uVar24 = (ulong)uVar20;
        }
        else {
          uVar3 = table[uVar11];
          if (uVar3 == 0) {
            if (0x1ff < uVar25) goto LAB_00114e99;
            table[uVar11] = ((ushort)uVar25 | uVar2) + 0x1000;
            bVar4 = true;
            uVar9 = uVar1;
            uVar23 = uVar25 + (long)(int)uVar18;
            uVar19 = uVar25;
          }
          else {
            if ((uVar3 >> 0xc & 1) != 0) {
              uVar19 = (ulong)(uVar3 & 0x1ff);
              uVar9 = (ulong)(uVar3 >> 9 & 7);
              bVar4 = true;
              if (uVar1 <= uVar9) goto LAB_00114deb;
            }
LAB_00114e99:
            bVar4 = false;
          }
LAB_00114deb:
          uVar14 = uVar11;
          if (bVar4) goto LAB_00114dfa;
          bVar4 = false;
        }
LAB_00114e81:
        if (!bVar4) goto LAB_00114eaf;
        uVar12 = uVar12 + 1;
        uVar14 = uVar11;
        uVar25 = uVar23;
      } while (uVar12 != uVar21);
      iVar13 = 0;
    }
LAB_00114eaf:
    if ((iVar13 != 0x1b) && (iVar13 != 0)) {
      return 0;
    }
    uVar8 = uVar8 - 1;
    if (uVar8 < 9) {
      return 1;
    }
  } while( true );
}

Assistant:

static int
elf_zlib_inflate_table (unsigned char *codes, size_t codes_len,
			uint16_t *zdebug_table, uint16_t *table)
{
  uint16_t count[16];
  uint16_t start[16];
  uint16_t prev[16];
  uint16_t firstcode[7];
  uint16_t *next;
  size_t i;
  size_t j;
  unsigned int code;
  size_t next_secondary;

  /* Count the number of code of each length.  Set NEXT[val] to be the
     next value after VAL with the same bit length.  */

  next = (uint16_t *) (((unsigned char *) zdebug_table)
		       + ZLIB_TABLE_WORK_OFFSET);

  memset (&count[0], 0, 16 * sizeof (uint16_t));
  for (i = 0; i < codes_len; ++i)
    {
      if (unlikely (codes[i] >= 16))
	{
	  elf_uncompress_failed ();
	  return 0;
	}

      if (count[codes[i]] == 0)
	{
	  start[codes[i]] = i;
	  prev[codes[i]] = i;
	}
      else
	{
	  next[prev[codes[i]]] = i;
	  prev[codes[i]] = i;
	}

      ++count[codes[i]];
    }

  /* For each length, fill in the table for the codes of that
     length.  */

  memset (table, 0, ZLIB_HUFFMAN_TABLE_SIZE * sizeof (uint16_t));

  /* Handle the values that do not require a secondary table.  */

  code = 0;
  for (j = 1; j <= 8; ++j)
    {
      unsigned int jcnt;
      unsigned int val;

      jcnt = count[j];
      if (jcnt == 0)
	continue;

      if (unlikely (jcnt > (1U << j)))
	{
	  elf_uncompress_failed ();
	  return 0;
	}

      /* There are JCNT values that have this length, the values
	 starting from START[j] continuing through NEXT[VAL].  Those
	 values are assigned consecutive values starting at CODE.  */

      val = start[j];
      for (i = 0; i < jcnt; ++i)
	{
	  uint16_t tval;
	  size_t ind;
	  unsigned int incr;

	  /* In the compressed bit stream, the value VAL is encoded as
	     J bits with the value C.  */

	  if (unlikely ((val & ~ZLIB_HUFFMAN_VALUE_MASK) != 0))
	    {
	      elf_uncompress_failed ();
	      return 0;
	    }

	  tval = val | ((j - 1) << ZLIB_HUFFMAN_BITS_SHIFT);

	  /* The table lookup uses 8 bits.  If J is less than 8, we
	     don't know what the other bits will be.  We need to fill
	     in all possibilities in the table.  Since the Huffman
	     code is unambiguous, those entries can't be used for any
	     other code.  */

	  for (ind = code; ind < 0x100; ind += 1 << j)
	    {
	      if (unlikely (table[ind] != 0))
		{
		  elf_uncompress_failed ();
		  return 0;
		}
	      table[ind] = tval;
	    }

	  /* Advance to the next value with this length.  */
	  if (i + 1 < jcnt)
	    val = next[val];

	  /* The Huffman codes are stored in the bitstream with the
	     most significant bit first, as is required to make them
	     unambiguous.  The effect is that when we read them from
	     the bitstream we see the bit sequence in reverse order:
	     the most significant bit of the Huffman code is the least
	     significant bit of the value we read from the bitstream.
	     That means that to make our table lookups work, we need
	     to reverse the bits of CODE.  Since reversing bits is
	     tedious and in general requires using a table, we instead
	     increment CODE in reverse order.  That is, if the number
	     of bits we are currently using, here named J, is 3, we
	     count as 000, 100, 010, 110, 001, 101, 011, 111, which is
	     to say the numbers from 0 to 7 but with the bits
	     reversed.  Going to more bits, aka incrementing J,
	     effectively just adds more zero bits as the beginning,
	     and as such does not change the numeric value of CODE.

	     To increment CODE of length J in reverse order, find the
	     most significant zero bit and set it to one while
	     clearing all higher bits.  In other words, add 1 modulo
	     2^J, only reversed.  */

	  incr = 1U << (j - 1);
	  while ((code & incr) != 0)
	    incr >>= 1;
	  if (incr == 0)
	    code = 0;
	  else
	    {
	      code &= incr - 1;
	      code += incr;
	    }
	}
    }

  /* Handle the values that require a secondary table.  */

  /* Set FIRSTCODE, the number at which the codes start, for each
     length.  */

  for (j = 9; j < 16; j++)
    {
      unsigned int jcnt;
      unsigned int k;

      jcnt = count[j];
      if (jcnt == 0)
	continue;

      /* There are JCNT values that have this length, the values
	 starting from START[j].  Those values are assigned
	 consecutive values starting at CODE.  */

      firstcode[j - 9] = code;

      /* Reverse add JCNT to CODE modulo 2^J.  */
      for (k = 0; k < j; ++k)
	{
	  if ((jcnt & (1U << k)) != 0)
	    {
	      unsigned int m;
	      unsigned int bit;

	      bit = 1U << (j - k - 1);
	      for (m = 0; m < j - k; ++m, bit >>= 1)
		{
		  if ((code & bit) == 0)
		    {
		      code += bit;
		      break;
		    }
		  code &= ~bit;
		}
	      jcnt &= ~(1U << k);
	    }
	}
      if (unlikely (jcnt != 0))
	{
	  elf_uncompress_failed ();
	  return 0;
	}
    }

  /* For J from 9 to 15, inclusive, we store COUNT[J] consecutive
     values starting at START[J] with consecutive codes starting at
     FIRSTCODE[J - 9].  In the primary table we need to point to the
     secondary table, and the secondary table will be indexed by J - 9
     bits.  We count down from 15 so that we install the larger
     secondary tables first, as the smaller ones may be embedded in
     the larger ones.  */

  next_secondary = 0; /* Index of next secondary table (after primary).  */
  for (j = 15; j >= 9; j--)
    {
      unsigned int jcnt;
      unsigned int val;
      size_t primary; /* Current primary index.  */
      size_t secondary; /* Offset to current secondary table.  */
      size_t secondary_bits; /* Bit size of current secondary table.  */

      jcnt = count[j];
      if (jcnt == 0)
	continue;

      val = start[j];
      code = firstcode[j - 9];
      primary = 0x100;
      secondary = 0;
      secondary_bits = 0;
      for (i = 0; i < jcnt; ++i)
	{
	  uint16_t tval;
	  size_t ind;
	  unsigned int incr;

	  if ((code & 0xff) != primary)
	    {
	      uint16_t tprimary;

	      /* Fill in a new primary table entry.  */

	      primary = code & 0xff;

	      tprimary = table[primary];
	      if (tprimary == 0)
		{
		  /* Start a new secondary table.  */

		  if (unlikely ((next_secondary & ZLIB_HUFFMAN_VALUE_MASK)
				!= next_secondary))
		    {
		      elf_uncompress_failed ();
		      return 0;
		    }

		  secondary = next_secondary;
		  secondary_bits = j - 8;
		  next_secondary += 1 << secondary_bits;
		  table[primary] = (secondary
				    + ((j - 8) << ZLIB_HUFFMAN_BITS_SHIFT)
				    + (1U << ZLIB_HUFFMAN_SECONDARY_SHIFT));
		}
	      else
		{
		  /* There is an existing entry.  It had better be a
		     secondary table with enough bits.  */
		  if (unlikely ((tprimary
				 & (1U << ZLIB_HUFFMAN_SECONDARY_SHIFT))
				== 0))
		    {
		      elf_uncompress_failed ();
		      return 0;
		    }
		  secondary = tprimary & ZLIB_HUFFMAN_VALUE_MASK;
		  secondary_bits = ((tprimary >> ZLIB_HUFFMAN_BITS_SHIFT)
				    & ZLIB_HUFFMAN_BITS_MASK);
		  if (unlikely (secondary_bits < j - 8))
		    {
		      elf_uncompress_failed ();
		      return 0;
		    }
		}
	    }

	  /* Fill in secondary table entries.  */

	  tval = val | ((j - 8) << ZLIB_HUFFMAN_BITS_SHIFT);

	  for (ind = code >> 8;
	       ind < (1U << secondary_bits);
	       ind += 1U << (j - 8))
	    {
	      if (unlikely (table[secondary + 0x100 + ind] != 0))
		{
		  elf_uncompress_failed ();
		  return 0;
		}
	      table[secondary + 0x100 + ind] = tval;
	    }

	  if (i + 1 < jcnt)
	    val = next[val];

	  incr = 1U << (j - 1);
	  while ((code & incr) != 0)
	    incr >>= 1;
	  if (incr == 0)
	    code = 0;
	  else
	    {
	      code &= incr - 1;
	      code += incr;
	    }
	}
    }

#ifdef BACKTRACE_GENERATE_FIXED_HUFFMAN_TABLE
  final_next_secondary = next_secondary;
#endif

  return 1;
}